

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O2

ssize_t xz_filter_read(archive_read_filter *self,void **p)

{
  lzma_stream *strm;
  lzma_stream *strm_00;
  int iVar1;
  lzma_ret ret;
  uint32_t uVar2;
  size_t sVar3;
  void *pvVar4;
  uint8_t *puVar5;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  char *fmt;
  size_t sStack_80;
  ssize_t avail_in;
  uchar props [5];
  lzma_filter filters [2];
  ssize_t local_38;
  
  strm = (lzma_stream *)self->data;
  sVar3 = strm[1].avail_in;
  strm->next_out = strm[1].next_in;
  strm->avail_out = sVar3;
  do {
    if ((sVar3 == 0) || (*(char *)&strm[1].next_out != '\0')) {
      sStack_80 = (long)strm->next_out - (long)strm[1].next_in;
      strm[1].total_in = strm[1].total_in + sStack_80;
      strm[1].total_out = strm[1].total_out + sStack_80;
      if (sStack_80 == 0) {
        *p = (void *)0x0;
        sStack_80 = 0;
      }
      else {
        *p = strm[1].next_in;
        if (self->code == 9) {
          uVar2 = lzma_crc32(strm[1].next_in,sStack_80,*(uint32_t *)((long)&strm[1].next_out + 4));
          *(uint32_t *)((long)&strm[1].next_out + 4) = uVar2;
          if (*(char *)&strm[1].next_out != '\0') {
            pvVar4 = self->data;
            sVar3 = (ulong)(*(char *)((long)pvVar4 + 0xa2) != '\0') * 8 + 0xc;
            piVar6 = (int *)__archive_read_filter_ahead(self->upstream,sVar3,(ssize_t *)filters);
            if (piVar6 == (int *)0x0 && (long)filters[0].id < 0) {
LAB_00501ef0:
              sStack_80 = 0xffffffffffffffe2;
            }
            else {
              if ((long)filters[0].id < (long)sVar3 || piVar6 == (int *)0x0) {
                fmt = "Lzip: Remaining data is less bytes";
              }
              else if (*(int *)((long)pvVar4 + 0xa4) == *piVar6) {
                if (*(long *)((long)pvVar4 + 0xb0) == *(long *)(piVar6 + 1)) {
                  if ((*(char *)((long)pvVar4 + 0xa2) != '\x01') ||
                     (*(long *)((long)pvVar4 + 0xa8) + sVar3 == *(long *)(piVar6 + 3))) {
                    __archive_read_filter_consume(self->upstream,sVar3);
                    iVar1 = lzip_has_member(self->upstream);
                    if (iVar1 == 0) {
                      return sStack_80;
                    }
                    *(undefined2 *)((long)pvVar4 + 0xa0) = 0;
                    *(undefined8 *)((long)pvVar4 + 0xa4) = 0;
                    *(undefined8 *)((long)pvVar4 + 0xac) = 0;
                    *(undefined4 *)((long)pvVar4 + 0xb4) = 0;
                    return sStack_80;
                  }
                  fmt = "Lzip: Member size error";
                }
                else {
                  fmt = "Lzip: Uncompressed size error";
                }
              }
              else {
                fmt = "Lzip: CRC32 error";
              }
              archive_set_error(&self->archive->archive,-1,fmt);
              sStack_80 = 0xffffffffffffffe7;
            }
          }
        }
      }
      return sStack_80;
    }
    if (*(char *)((long)&strm[1].next_out + 1) == '\0') {
      strm_00 = (lzma_stream *)self->data;
      pvVar4 = __archive_read_filter_ahead(self->upstream,6,&local_38);
      if (pvVar4 != (void *)0x0) {
        *(undefined1 *)((long)&strm_00[1].next_out + 2) = *(undefined1 *)((long)pvVar4 + 4);
        props[0] = ']';
        uVar7 = *(byte *)((long)pvVar4 + 5) & 0x1f;
        if (0xffffffef < uVar7 - 0x1c) {
          uVar8 = 1 << (sbyte)uVar7;
          iVar1 = (uint)(*(byte *)((long)pvVar4 + 5) >> 5) * (uVar8 >> 4);
          if (uVar7 < 0xd) {
            iVar1 = 0;
          }
          props._1_4_ = uVar8 - iVar1;
          __archive_read_filter_consume(self->upstream,6);
          strm_00[1].avail_out = 6;
          filters[0].id = 0x4000000000000001;
          filters[0].options = (void *)0x0;
          filters[1].id = 0xffffffffffffffff;
          filters[1].options = (void *)0x0;
          ret = lzma_properties_decode(filters,(lzma_allocator *)0x0,props,5);
          if (ret == LZMA_OK) {
            ret = lzma_raw_decoder(strm_00,filters);
            free(filters[0].options);
            if (ret == LZMA_OK) {
              *(undefined1 *)((long)&strm[1].next_out + 1) = 1;
              goto LAB_00501d70;
            }
          }
LAB_00501eeb:
          set_error(self,ret);
        }
      }
      goto LAB_00501ef0;
    }
LAB_00501d70:
    puVar5 = (uint8_t *)__archive_read_filter_ahead(self->upstream,1,&avail_in);
    strm->next_in = puVar5;
    if (avail_in < 0 && puVar5 == (uint8_t *)0x0) {
      archive_set_error(&self->archive->archive,-1,"truncated input");
      goto LAB_00501ef0;
    }
    strm->avail_in = avail_in;
    ret = lzma_code(strm,(uint)(avail_in == 0) * 3);
    if (ret != LZMA_OK) {
      if (ret != LZMA_STREAM_END) goto LAB_00501eeb;
      *(undefined1 *)&strm[1].next_out = 1;
    }
    __archive_read_filter_consume(self->upstream,avail_in - strm->avail_in);
    strm[1].avail_out = strm[1].avail_out + (avail_in - strm->avail_in);
    sVar3 = strm->avail_out;
  } while( true );
}

Assistant:

static ssize_t
xz_filter_read(struct archive_read_filter *self, const void **p)
{
	struct private_data *state;
	size_t decompressed;
	ssize_t avail_in;
	int ret;

	state = (struct private_data *)self->data;

	/* Empty our output buffer. */
	state->stream.next_out = state->out_block;
	state->stream.avail_out = state->out_block_size;

	/* Try to fill the output buffer. */
	while (state->stream.avail_out > 0 && !state->eof) {
		if (!state->in_stream) {
			/*
			 * Initialize liblzma for lzip
			 */
			ret = lzip_init(self);
			if (ret != ARCHIVE_OK)
				return (ret);
			state->in_stream = 1;
		}
		state->stream.next_in =
		    __archive_read_filter_ahead(self->upstream, 1, &avail_in);
		if (state->stream.next_in == NULL && avail_in < 0) {
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "truncated input");
			return (ARCHIVE_FATAL);
		}
		state->stream.avail_in = avail_in;

		/* Decompress as much as we can in one pass. */
		ret = lzma_code(&(state->stream),
		    (state->stream.avail_in == 0)? LZMA_FINISH: LZMA_RUN);
		switch (ret) {
		case LZMA_STREAM_END: /* Found end of stream. */
			state->eof = 1;
			/* FALL THROUGH */
		case LZMA_OK: /* Decompressor made some progress. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			state->member_in +=
			    avail_in - state->stream.avail_in;
			break;
		default:
			set_error(self, ret);
			return (ARCHIVE_FATAL);
		}
	}

	decompressed = state->stream.next_out - state->out_block;
	state->total_out += decompressed;
	state->member_out += decompressed;
	if (decompressed == 0)
		*p = NULL;
	else {
		*p = state->out_block;
		if (self->code == ARCHIVE_FILTER_LZIP) {
			state->crc32 = lzma_crc32(state->out_block,
			    decompressed, state->crc32);
			if (state->eof) {
				ret = lzip_tail(self);
				if (ret != ARCHIVE_OK)
					return (ret);
			}
		}
	}
	return (decompressed);
}